

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdhuff.c
# Opt level: O3

boolean decode_mcu(j_decompress_ptr cinfo,JBLOCKROW *MCU_data)

{
  jpeg_entropy_decoder *pjVar1;
  jpeg_component_info *pjVar2;
  long lVar3;
  jpeg_error_mgr *pjVar4;
  ushort uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  JBLOCKROW paJVar13;
  long lVar14;
  uchar *puVar15;
  _func_boolean_j_decompress_ptr_JBLOCKROW_ptr *p_Var16;
  ushort uVar17;
  long lVar19;
  uint uVar18;
  
  pjVar1 = cinfo->entropy;
  if (cinfo->restart_interval != 0) {
    iVar9 = *(int *)((long)&pjVar1[3].start_pass + 4);
    if (iVar9 == 0) {
      process_restart(cinfo);
      iVar9 = *(int *)((long)&pjVar1[3].start_pass + 4);
    }
    *(int *)((long)&pjVar1[3].start_pass + 4) = iVar9 + -1;
  }
  if ((pjVar1[1].insufficient_data != -1) && (0 < cinfo->blocks_in_MCU)) {
    lVar12 = 0;
    do {
      if (MCU_data == (JBLOCKROW *)0x0) {
        paJVar13 = (JBLOCKROW)0x0;
      }
      else {
        paJVar13 = MCU_data[lVar12];
      }
      lVar19 = (long)cinfo->MCU_membership[lVar12];
      pjVar2 = cinfo->cur_comp_info[lVar19];
      iVar9 = pjVar2->dc_tbl_no;
      p_Var16 = (&pjVar1[3].decode_mcu)[iVar9] +
                *(int *)((long)&pjVar1[2].decode_mcu + lVar19 * 4 + 4);
      iVar6 = arith_decode(cinfo,(uchar *)p_Var16);
      if (iVar6 == 0) {
        *(undefined4 *)((long)&pjVar1[2].decode_mcu + lVar19 * 4 + 4) = 0;
      }
      else {
        uVar7 = arith_decode(cinfo,(uchar *)(p_Var16 + 1));
        p_Var16 = p_Var16 + (ulong)uVar7 + 2;
        iVar6 = arith_decode(cinfo,(uchar *)p_Var16);
        uVar18 = 0;
        if (iVar6 != 0) {
          p_Var16 = (&pjVar1[3].decode_mcu)[iVar9] + 0x14;
          iVar6 = arith_decode(cinfo,(uchar *)p_Var16);
          uVar18 = 1;
          while (iVar6 != 0) {
            uVar18 = uVar18 * 2;
            if (uVar18 == 0x8000) {
LAB_00135b64:
              pjVar4 = cinfo->err;
              pjVar4->msg_code = 0x7e;
              (*pjVar4->emit_message)((j_common_ptr)cinfo,-1);
              pjVar1[1].insufficient_data = -1;
              return 1;
            }
            p_Var16 = p_Var16 + 1;
            iVar6 = arith_decode(cinfo,(uchar *)p_Var16);
          }
        }
        iVar6 = 0;
        if ((int)((ulong)(1L << (cinfo->arith_dc_L[iVar9] & 0x3f)) >> 1) <= (int)uVar18) {
          if ((int)((ulong)(1L << (cinfo->arith_dc_U[iVar9] & 0x3f)) >> 1) < (int)uVar18) {
            iVar6 = uVar7 * 4 + 0xc;
          }
          else {
            iVar6 = uVar7 * 4 + 4;
          }
        }
        *(int *)((long)&pjVar1[2].decode_mcu + lVar19 * 4 + 4) = iVar6;
        uVar11 = uVar18;
        if (1 < uVar18) {
          do {
            uVar18 = (int)uVar18 >> 1;
            uVar8 = arith_decode(cinfo,(uchar *)(p_Var16 + 0xe));
            if (uVar8 != 0) {
              uVar8 = uVar18;
            }
            uVar11 = uVar11 | uVar8;
          } while (1 < uVar18);
        }
        uVar18 = ~uVar11;
        if (uVar7 == 0) {
          uVar18 = uVar11 + 1;
        }
        *(uint *)(&pjVar1[1].field_0x14 + lVar19 * 4) =
             uVar18 + *(int *)(&pjVar1[1].field_0x14 + lVar19 * 4) & 0xffff;
      }
      if (paJVar13 != (JBLOCKROW)0x0) {
        (*paJVar13)[0] = *(JCOEF *)(&pjVar1[1].field_0x14 + lVar19 * 4);
      }
      lVar19 = (long)pjVar2->ac_tbl_no;
      iVar9 = 1;
      do {
        lVar3 = *(long *)(&pjVar1[8].insufficient_data + lVar19 * 2);
        lVar14 = (long)(iVar9 * 3 + -3);
        iVar6 = arith_decode(cinfo,(uchar *)(lVar3 + lVar14));
        if (iVar6 != 0) break;
        puVar15 = (uchar *)(lVar14 + lVar3 + 2);
        iVar6 = iVar9;
        while (iVar9 = arith_decode(cinfo,puVar15 + -1), iVar9 == 0) {
          iVar6 = iVar6 + 1;
          puVar15 = puVar15 + 3;
          if (iVar6 == 0x40) goto LAB_00135b64;
        }
        iVar9 = arith_decode(cinfo,(uchar *)(pjVar1 + 0xe));
        iVar10 = arith_decode(cinfo,puVar15);
        if (iVar10 == 0) {
          uVar17 = 0;
        }
        else {
          iVar10 = arith_decode(cinfo,puVar15);
          if (iVar10 == 0) {
            uVar17 = 1;
          }
          else {
            lVar3 = *(long *)(&pjVar1[8].insufficient_data + lVar19 * 2);
            lVar14 = 0xbd;
            if ((int)(uint)cinfo->arith_ac_K[lVar19] < iVar6) {
              lVar14 = 0xd9;
            }
            puVar15 = (uchar *)(lVar3 + lVar14);
            iVar10 = arith_decode(cinfo,puVar15);
            if (iVar10 == 0) {
              puVar15 = puVar15 + 0xe;
              uVar18 = 2;
              uVar7 = uVar18;
            }
            else {
              puVar15 = (uchar *)(lVar3 + lVar14 + 0xe);
              uVar18 = 2;
              do {
                uVar18 = uVar18 * 2;
                if (uVar18 == 0x8000) goto LAB_00135b64;
                iVar10 = arith_decode(cinfo,puVar15 + -0xd);
                puVar15 = puVar15 + 1;
              } while (iVar10 != 0);
              uVar7 = uVar18;
              if (uVar18 == 0) {
                uVar17 = 0;
                goto LAB_00135b05;
              }
            }
            do {
              uVar7 = (int)uVar7 >> 1;
              uVar11 = arith_decode(cinfo,puVar15);
              if (uVar11 != 0) {
                uVar11 = uVar7;
              }
              uVar18 = uVar18 | uVar11;
              uVar17 = (ushort)uVar18;
            } while (1 < uVar7);
          }
        }
LAB_00135b05:
        if (paJVar13 != (JBLOCKROW)0x0) {
          uVar5 = ~uVar17;
          if (iVar9 == 0) {
            uVar5 = uVar17 + 1;
          }
          (*paJVar13)[jpeg_natural_order[iVar6]] = uVar5;
        }
        iVar9 = iVar6 + 1;
      } while (iVar6 < 0x3f);
      lVar12 = lVar12 + 1;
    } while (lVar12 < cinfo->blocks_in_MCU);
  }
  return 1;
}

Assistant:

METHODDEF(boolean)
decode_mcu(j_decompress_ptr cinfo, JBLOCKROW *MCU_data)
{
  huff_entropy_ptr entropy = (huff_entropy_ptr)cinfo->entropy;
  int usefast = 1;

  /* Process restart marker if needed; may have to suspend */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0)
      if (!process_restart(cinfo))
        return FALSE;
    usefast = 0;
  }

  if (cinfo->src->bytes_in_buffer < BUFSIZE * (size_t)cinfo->blocks_in_MCU ||
      cinfo->unread_marker != 0)
    usefast = 0;

  /* If we've run out of data, just leave the MCU set to zeroes.
   * This way, we return uniform gray for the remainder of the segment.
   */
  if (!entropy->pub.insufficient_data) {

    if (usefast) {
      if (!decode_mcu_fast(cinfo, MCU_data)) goto use_slow;
    } else {
use_slow:
      if (!decode_mcu_slow(cinfo, MCU_data)) return FALSE;
    }

  }

  /* Account for restart interval (no-op if not using restarts) */
  if (cinfo->restart_interval)
    entropy->restarts_to_go--;

  return TRUE;
}